

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

void __thiscall
ON_Annotation::SetDimRadialTextOrientation
          (ON_Annotation *this,ON_DimStyle *parent_style,TextOrientation value)

{
  TextOrientation TVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  TVar1 = ON_DimStyle::DimRadialTextOrientation(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,TVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetDimRadialTextOrientation(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,DimRadialTextOrientation,TVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetDimRadialTextOrientation(const ON_DimStyle* parent_style, ON::TextOrientation value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->DimRadialTextOrientation());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetDimRadialTextOrientation(value);
    override_style->SetFieldOverride(ON_DimStyle::field::DimRadialTextOrientation, bCreate);
  }
}